

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::RandModeFunc::checkArguments
          (RandModeFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  ulong uVar1;
  Compilation *pCVar2;
  ulong min;
  bool bVar3;
  Type *pTVar4;
  
  uVar1 = (context->flags).m_bits;
  pCVar2 = ((context->scope).ptr)->compilation;
  min = (ulong)(((uint)uVar1 & 0x100) >> 8);
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,true,args,range,min,min);
  if (bVar3) {
    if ((uVar1 & 0x100) == 0) {
      pTVar4 = pCVar2->intType;
    }
    else {
      bVar3 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
      if (!bVar3) {
        pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
        return pTVar4;
      }
      pTVar4 = pCVar2->voidType;
    }
  }
  else {
    pTVar4 = pCVar2->errorType;
  }
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        // The number of arguments required is 1 if called as a task
        // and 0 if called as a function.
        auto& comp = context.getCompilation();
        size_t numArgs = context.flags.has(ASTFlags::TopLevelStatement) ? 1 : 0;
        if (!checkArgCount(context, true, args, range, numArgs, numArgs))
            return comp.getErrorType();

        if (numArgs) {
            // First argument is integral.
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return numArgs ? comp.getVoidType() : comp.getIntType();
    }